

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  ParsedInternalKey local_98;
  string local_70;
  string local_50;
  
  iVar6 = 0;
  bVar2 = SomeFileOverlapsRange
                    (&this->vset_->icmp_,false,this->files_,smallest_user_key,largest_user_key);
  if (!bVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_98.user_key.data_ = smallest_user_key->data_;
    local_98.user_key.size_ = smallest_user_key->size_;
    local_98.sequence = 0xffffffffffffff;
    local_98.type = kTypeValue;
    AppendInternalKey(&local_50,&local_98);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_98.user_key.data_ = largest_user_key->data_;
    local_98.user_key.size_ = largest_user_key->size_;
    local_98.sequence = 0;
    local_98.type = kTypeDeletion;
    AppendInternalKey(&local_70,&local_98);
    local_98.sequence = 0;
    local_98.user_key.data_ = (char *)0x0;
    local_98.user_key.size_ = 0;
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      bVar2 = SomeFileOverlapsRange
                        (&this->vset_->icmp_,true,this->files_ + lVar1,smallest_user_key,
                         largest_user_key);
      if (bVar2) goto LAB_0011e5a6;
      GetOverlappingInputs
                (this,(uint)lVar7 | 2,(InternalKey *)&local_50,(InternalKey *)&local_70,
                 (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &local_98);
      if (local_98.user_key.size_ - (long)local_98.user_key.data_ == 0) {
        lVar4 = 0;
      }
      else {
        lVar3 = (long)(local_98.user_key.size_ - (long)local_98.user_key.data_) >> 3;
        lVar5 = 0;
        lVar4 = 0;
        do {
          lVar4 = lVar4 + *(long *)(*(long *)(local_98.user_key.data_ + lVar5 * 8) + 0x10);
          lVar5 = lVar5 + 1;
        } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
      }
      if ((long)(this->vset_->options_->max_file_size * 10) < lVar4) goto LAB_0011e5a6;
      lVar7 = lVar1;
    } while (lVar1 != 2);
    lVar7 = 2;
LAB_0011e5a6:
    iVar6 = (int)lVar7;
    if (local_98.user_key.data_ != (char *)0x0) {
      operator_delete(local_98.user_key.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return iVar6;
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}